

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O0

void __thiscall QPrinter::setCollateCopies(QPrinter *this,bool collate)

{
  byte bVar1;
  int iVar2;
  QPrinterPrivate *value;
  byte in_SIL;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QPrinterPrivate *d;
  char *in_stack_ffffffffffffff98;
  QPrinterPrivate *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  char local_48 [4];
  PrintEnginePropertyKey in_stack_ffffffffffffffbc;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  value = d_func((QPrinter *)0x144f8e);
  iVar2 = (*value->printEngine->_vptr_QPrintEngine[7])();
  if (iVar2 == 1) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),(int)((ulong)value >> 0x20),
               in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_48,"%s: Cannot be changed while printer is active","QPrinter::setCollateCopies"
              );
  }
  else {
    this_00 = value;
    QVariant::QVariant(&local_28,(bool)(bVar1 & 1));
    QPrinterPrivate::setProperty(this_00,in_stack_ffffffffffffffbc,(QVariant *)value);
    QVariant::~QVariant(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrinter::setCollateCopies(bool collate)
{
    Q_D(QPrinter);
    ABORT_IF_ACTIVE("QPrinter::setCollateCopies");
    d->setProperty(QPrintEngine::PPK_CollateCopies, collate);
}